

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_ghost_spells_off(parser *p)

{
  long *plVar1;
  errr eVar2;
  void *pvVar3;
  long *plVar4;
  char *pcVar5;
  char *flag_name;
  parser_error pVar6;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("g",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x87e,"enum parser_error parse_ghost_spells_off(struct parser *)");
  }
  plVar1 = *(long **)((long)pvVar3 + 0x18);
  do {
    plVar4 = plVar1;
    plVar1 = (long *)*plVar4;
  } while (plVar1 != (long *)0x0);
  pcVar5 = parser_getstr(p,"spells");
  pcVar5 = string_make(pcVar5);
  flag_name = strtok(pcVar5," |");
  if (flag_name == (char *)0x0) {
    pVar6 = PARSE_ERROR_NONE;
  }
  else {
    do {
      eVar2 = grab_flag((bitflag *)((long)plVar4 + 0x6d),0xd,r_info_spell_flags,flag_name);
      if (eVar2 != 0) {
        quit_fmt("bad spell flag: %s",flag_name);
        pVar6 = PARSE_ERROR_INVALID_FLAG;
        break;
      }
      pVar6 = PARSE_ERROR_NONE;
      flag_name = strtok((char *)0x0," |");
    } while (flag_name != (char *)0x0);
  }
  mem_free(pcVar5);
  return pVar6;
}

Assistant:

static enum parser_error parse_ghost_spells_off(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	char *flags;
	char *s;
	int ret = PARSE_ERROR_NONE;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	flags = string_make(parser_getstr(p, "spells"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(l->spell_flags_off, RSF_SIZE, r_info_spell_flags, s)) {
			quit_fmt("bad spell flag: %s", s);
			ret = PARSE_ERROR_INVALID_FLAG;
			break;
		}
		s = strtok(NULL, " |");
	}

	mem_free(flags);
	return ret;
}